

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_evsa.cpp
# Opt level: O0

void __thiscall phoenix_evsa_t::evsa_guid_t::~evsa_guid_t(evsa_guid_t *this)

{
  evsa_guid_t *this_local;
  
  ~evsa_guid_t(this);
  operator_delete(this);
  return;
}

Assistant:

phoenix_evsa_t::evsa_guid_t::~evsa_guid_t() {
    _clean_up();
}